

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.hpp
# Opt level: O2

intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 boost::xpressive::detail::
 optimize_regex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           (finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *peeker,long *tr,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *param_3)

{
  counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pcVar1;
  undefined8 *puVar2;
  _func_int *p_Var3;
  line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
  *this;
  _func_int **pp_Var4;
  size_t sVar5;
  
  if (*(char *)((long)tr + 0x21) == '\x01') {
    this = (line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
            *)operator_new(0x110);
    line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
    ::line_start_finder(this,param_3);
    peeker->_vptr_finder = (_func_int **)this;
    LOCK();
    pcVar1 = &(this->
              super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ;
    (pcVar1->count_).value_ = (pcVar1->count_).value_ + 1;
    UNLOCK();
  }
  else {
    if ((int)tr[7] < 1) {
      sVar5 = std::_Base_bitset<4UL>::_M_do_count((_Base_bitset<4UL> *)(*tr + 8));
      if (sVar5 == 0x100) {
        peeker->_vptr_finder = (_func_int **)0x0;
        return (intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )peeker;
      }
      pp_Var4 = (_func_int **)operator_new(0x38);
      puVar2 = (undefined8 *)*tr;
      *(undefined4 *)(pp_Var4 + 1) = 0;
      *pp_Var4 = (_func_int *)&PTR__finder_00188c40;
      pp_Var4[6] = (_func_int *)puVar2[4];
      p_Var3 = (_func_int *)puVar2[3];
      pp_Var4[4] = (_func_int *)puVar2[2];
      pp_Var4[5] = p_Var3;
      p_Var3 = (_func_int *)puVar2[1];
      pp_Var4[2] = (_func_int *)*puVar2;
      pp_Var4[3] = p_Var3;
    }
    else {
      pp_Var4 = (_func_int **)operator_new(0x10);
      *(undefined4 *)(pp_Var4 + 1) = 0;
      *pp_Var4 = (_func_int *)&PTR__finder_00188bf8;
    }
    peeker->_vptr_finder = pp_Var4;
    LOCK();
    *(int *)(pp_Var4 + 1) = *(int *)(pp_Var4 + 1) + 1;
    UNLOCK();
  }
  return (intrusive_ptr<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )peeker;
}

Assistant:

intrusive_ptr<finder<BidiIter> > optimize_regex
(
    xpression_peeker<typename iterator_value<BidiIter>::type> const &peeker
  , Traits const &tr
  , mpl::false_
)
{
    if(peeker.line_start())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new line_start_finder<BidiIter, Traits>(tr)
        );
    }
    else if(peeker.leading_simple_repeat())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new leading_simple_repeat_finder<BidiIter>()
        );
    }
    else if(256 != peeker.bitset().count())
    {
        return intrusive_ptr<finder<BidiIter> >
        (
            new hash_peek_finder<BidiIter, Traits>(peeker.bitset())
        );
    }

    return intrusive_ptr<finder<BidiIter> >();
}